

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Instance::Mark(Instance *this,Store *store)

{
  bool bVar1;
  reference this_00;
  ElemSegment *elem;
  iterator __end2;
  iterator __begin2;
  vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_> *__range2;
  Store *store_local;
  Instance *this_local;
  
  Store::Mark(store,(Ref)(this->module_).index);
  Store::Mark(store,&this->imports_);
  Store::Mark(store,&this->funcs_);
  Store::Mark(store,&this->memories_);
  Store::Mark(store,&this->tables_);
  Store::Mark(store,&this->globals_);
  Store::Mark(store,&this->events_);
  Store::Mark(store,&this->exports_);
  __end2 = std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::begin
                     (&this->elems_);
  elem = (ElemSegment *)
         std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::end
                   (&this->elems_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
                                *)&elem);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
              ::operator*(&__end2);
    ElemSegment::Mark(this_00,store);
    __gnu_cxx::
    __normal_iterator<wabt::interp::ElemSegment_*,_std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Instance::Mark(Store& store) {
  store.Mark(module_);
  store.Mark(imports_);
  store.Mark(funcs_);
  store.Mark(memories_);
  store.Mark(tables_);
  store.Mark(globals_);
  store.Mark(events_);
  store.Mark(exports_);
  for (auto&& elem : elems_) {
    elem.Mark(store);
  }
}